

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O2

int LogLuvDecodeStrip(TIFF *tif,uint8_t *bp,tmsize_t cc,uint16_t s)

{
  int iVar1;
  uint uVar2;
  tmsize_t tVar3;
  long lVar4;
  
  tVar3 = TIFFScanlineSize(tif);
  if (tVar3 == 0) {
    uVar2 = 0;
  }
  else {
    if (cc % tVar3 != 0) {
      __assert_fail("cc % rowlen == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                    ,0x18e,"int LogLuvDecodeStrip(TIFF *, uint8_t *, tmsize_t, uint16_t)");
    }
    for (lVar4 = 0; cc != lVar4; lVar4 = lVar4 + tVar3) {
      iVar1 = (*tif->tif_decoderow)(tif,bp + lVar4,tVar3,s);
      if (iVar1 == 0) break;
    }
    uVar2 = (uint)(cc == lVar4);
  }
  return uVar2;
}

Assistant:

static int LogLuvDecodeStrip(TIFF *tif, uint8_t *bp, tmsize_t cc, uint16_t s)
{
    tmsize_t rowlen = TIFFScanlineSize(tif);

    if (rowlen == 0)
        return 0;

    assert(cc % rowlen == 0);
    while (cc && (*tif->tif_decoderow)(tif, bp, rowlen, s))
    {
        bp += rowlen;
        cc -= rowlen;
    }
    return (cc == 0);
}